

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer1.c
# Opt level: O3

ktx_error_code_e ktxTexture1_WriteKTX2ToNamedFile(ktxTexture1 *This,char *dstname)

{
  ktx_error_code_e kVar1;
  FILE *__stream;
  
  if (This == (ktxTexture1 *)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    __stream = fopen(dstname,"wb");
    if (__stream == (FILE *)0x0) {
      kVar1 = KTX_FILE_OPEN_FAILED;
    }
    else {
      kVar1 = ktxTexture1_WriteKTX2ToStdioStream(This,(FILE *)__stream);
      fclose(__stream);
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture1_WriteKTX2ToNamedFile(ktxTexture1* This, const char* const dstname)
{
    KTX_error_code result;
    FILE* dst;

    if (!This)
        return KTX_INVALID_VALUE;

    dst = ktxFOpenUTF8(dstname, "wb");
    if (dst) {
        result = ktxTexture1_WriteKTX2ToStdioStream(This, dst);
        fclose(dst);
    } else
        result = KTX_FILE_OPEN_FAILED;

    return result;
}